

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O3

void BZ2_compressBlock(EState *s,Bool is_last_block)

{
  UChar (*paUVar1) [258];
  Int32 (*paIVar2) [258];
  short *psVar3;
  UChar UVar4;
  UChar UVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  UChar UVar78;
  undefined4 *puVar79;
  undefined8 uVar80;
  byte bVar81;
  byte bVar82;
  uint uVar83;
  int iVar84;
  int iVar85;
  uint uVar86;
  long lVar87;
  UInt32 *pUVar88;
  int iVar89;
  int iVar90;
  uint uVar91;
  ulong uVar92;
  size_t sVar93;
  Bool *pBVar94;
  ushort *puVar95;
  UChar UVar96;
  undefined7 in_register_00000031;
  ulong uVar97;
  UInt32 UVar98;
  char cVar99;
  Int32 IVar100;
  UInt16 *pUVar101;
  long lVar102;
  ulong uVar103;
  size_t sVar104;
  UChar *pUVar105;
  Int32 (*freq) [258];
  UChar (*paUVar106) [258];
  UInt16 *pUVar107;
  ulong uVar108;
  ulong uVar109;
  ulong uVar110;
  Int32 IVar111;
  ulong uVar112;
  bool bVar113;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  long lVar128;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  int iVar172;
  int iVar176;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  UInt16 cost [6];
  Int32 fave [6];
  UChar local_1d8 [16];
  ulong local_1c8;
  UInt16 *local_1c0;
  uint local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  undefined1 local_1a8 [16];
  size_t local_190;
  ulong local_188;
  ulong local_180;
  undefined4 local_174;
  ulong local_170;
  undefined1 local_168 [16];
  Bool *local_158;
  UInt32 *local_150;
  size_t local_148;
  UChar (*local_140) [258];
  undefined4 local_138;
  char acStack_134 [260];
  
  iVar90 = s->nblock;
  if (0 < iVar90) {
    uVar83 = s->blockCRC;
    s->blockCRC = ~uVar83;
    s->combinedCRC = (s->combinedCRC << 1 | (uint)((int)s->combinedCRC < 0)) ^ ~uVar83;
    if (1 < s->blockNo) {
      s->numZ = 0;
    }
    if (1 < s->verbosity) {
      fprintf(_stderr,"    block %d: crc = 0x%08x, combined CRC = 0x%08x, size = %d\n");
    }
    BZ2_blockSort(s);
    iVar90 = s->nblock;
  }
  s->zbits = (UChar *)((long)iVar90 + (long)s->arr2);
  if (s->blockNo == 1) {
    s->bsBuff = 0;
    s->bsLive = 0;
    bsPutUChar(s,'B');
    bsPutUChar(s,'Z');
    bsPutUChar(s,'h');
    bsPutUChar(s,(char)s->blockSize100k + '0');
    iVar90 = s->nblock;
  }
  if (iVar90 < 1) goto LAB_004a94eb;
  bsPutUChar(s,'1');
  bsPutUChar(s,'A');
  bsPutUChar(s,'Y');
  bsPutUChar(s,'&');
  bsPutUChar(s,'S');
  bsPutUChar(s,'Y');
  bsPutUInt32(s,s->blockCRC);
  iVar90 = s->bsLive;
  if (iVar90 < 8) {
    uVar83 = s->bsBuff;
  }
  else {
    uVar83 = s->bsBuff;
    iVar89 = s->numZ;
    do {
      s->zbits[iVar89] = (UChar)(uVar83 >> 0x18);
      iVar89 = s->numZ + 1;
      s->numZ = iVar89;
      uVar83 = s->bsBuff << 8;
      s->bsBuff = uVar83;
      iVar84 = s->bsLive;
      iVar90 = iVar84 + -8;
      s->bsLive = iVar90;
    } while (0xf < iVar84);
  }
  iVar89 = iVar90 + 1;
  s->bsBuff = uVar83;
  s->bsLive = iVar89;
  iVar84 = s->origPtr;
  local_174 = (int)CONCAT71(in_register_00000031,is_last_block);
  if (6 < iVar90) {
    iVar90 = s->numZ;
    do {
      s->zbits[iVar90] = (UChar)(uVar83 >> 0x18);
      iVar90 = s->numZ + 1;
      s->numZ = iVar90;
      uVar83 = s->bsBuff << 8;
      s->bsBuff = uVar83;
      iVar85 = s->bsLive;
      iVar89 = iVar85 + -8;
      s->bsLive = iVar89;
    } while (0xf < iVar85);
  }
  s->bsBuff = iVar84 << (8U - (char)iVar89 & 0x1f) | uVar83;
  s->bsLive = iVar89 + 0x18;
  pUVar88 = s->ptr;
  pUVar105 = s->block;
  pUVar107 = s->mtfv;
  s->nInUse = 0;
  local_158 = s->inUse;
  uVar83 = 0;
  lVar87 = -0x100;
  do {
    if (s->unseqToSeq[lVar87] != '\0') {
      *(char *)((long)s->mtfFreq + lVar87 + -0x20) = (char)uVar83;
      uVar83 = uVar83 + 1;
      s->nInUse = uVar83;
    }
    lVar87 = lVar87 + 1;
  } while (lVar87 != 0);
  if ((-2 < (int)uVar83) && (memset(s->mtfFreq,0,(ulong)(uVar83 + 2) << 2), 0 < (int)uVar83)) {
    lVar87 = (ulong)uVar83 - 1;
    local_1a8._8_4_ = (int)lVar87;
    local_1a8._0_8_ = lVar87;
    local_1a8._12_4_ = (int)((ulong)lVar87 >> 0x20);
    uVar92 = 0;
    auVar114 = local_1a8;
    auVar131 = _DAT_009b63a0;
    auVar129 = _DAT_009b63b0;
    auVar134 = _DAT_009b63c0;
    auVar142 = _DAT_009b63d0;
    auVar144 = _DAT_009b63e0;
    auVar145 = _DAT_009b63f0;
    auVar146 = _DAT_0093e4e0;
    auVar147 = _DAT_0093d210;
    do {
      auVar157 = local_1a8 ^ _DAT_0093d220;
      auVar159 = auVar147 ^ _DAT_0093d220;
      iVar90 = auVar157._0_4_;
      iVar172 = -(uint)(iVar90 < auVar159._0_4_);
      iVar89 = auVar157._4_4_;
      auVar161._4_4_ = -(uint)(iVar89 < auVar159._4_4_);
      iVar84 = auVar157._8_4_;
      iVar176 = -(uint)(iVar84 < auVar159._8_4_);
      iVar85 = auVar157._12_4_;
      auVar161._12_4_ = -(uint)(iVar85 < auVar159._12_4_);
      auVar157._4_4_ = iVar172;
      auVar157._0_4_ = iVar172;
      auVar157._8_4_ = iVar176;
      auVar157._12_4_ = iVar176;
      auVar157 = pshuflw(auVar114,auVar157,0xe8);
      auVar160._4_4_ = -(uint)(auVar159._4_4_ == iVar89);
      auVar160._12_4_ = -(uint)(auVar159._12_4_ == iVar85);
      auVar160._0_4_ = auVar160._4_4_;
      auVar160._8_4_ = auVar160._12_4_;
      auVar148 = pshuflw(in_XMM11,auVar160,0xe8);
      auVar161._0_4_ = auVar161._4_4_;
      auVar161._8_4_ = auVar161._12_4_;
      auVar159 = pshuflw(auVar157,auVar161,0xe8);
      auVar114._8_4_ = 0xffffffff;
      auVar114._0_8_ = 0xffffffffffffffff;
      auVar114._12_4_ = 0xffffffff;
      auVar114 = (auVar159 | auVar148 & auVar157) ^ auVar114;
      auVar114 = packssdw(auVar114,auVar114);
      cVar99 = (char)uVar92;
      if ((auVar114 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)&local_138 + uVar92) = cVar99;
      }
      auVar148._4_4_ = iVar172;
      auVar148._0_4_ = iVar172;
      auVar148._8_4_ = iVar176;
      auVar148._12_4_ = iVar176;
      auVar161 = auVar160 & auVar148 | auVar161;
      auVar114 = packssdw(auVar161,auVar161);
      auVar159._8_4_ = 0xffffffff;
      auVar159._0_8_ = 0xffffffffffffffff;
      auVar159._12_4_ = 0xffffffff;
      auVar114 = packssdw(auVar114 ^ auVar159,auVar114 ^ auVar159);
      auVar114 = packsswb(auVar114,auVar114);
      if ((auVar114._0_4_ >> 8 & 1) != 0) {
        *(char *)((long)&local_138 + uVar92 + 1) = cVar99 + '\x01';
      }
      auVar114 = auVar146 ^ _DAT_0093d220;
      auVar149._0_4_ = -(uint)(iVar90 < auVar114._0_4_);
      auVar149._4_4_ = -(uint)(iVar89 < auVar114._4_4_);
      auVar149._8_4_ = -(uint)(iVar84 < auVar114._8_4_);
      auVar149._12_4_ = -(uint)(iVar85 < auVar114._12_4_);
      auVar162._4_4_ = auVar149._0_4_;
      auVar162._0_4_ = auVar149._0_4_;
      auVar162._8_4_ = auVar149._8_4_;
      auVar162._12_4_ = auVar149._8_4_;
      iVar172 = -(uint)(auVar114._4_4_ == iVar89);
      iVar176 = -(uint)(auVar114._12_4_ == iVar85);
      auVar65._4_4_ = iVar172;
      auVar65._0_4_ = iVar172;
      auVar65._8_4_ = iVar176;
      auVar65._12_4_ = iVar176;
      auVar173._4_4_ = auVar149._4_4_;
      auVar173._0_4_ = auVar149._4_4_;
      auVar173._8_4_ = auVar149._12_4_;
      auVar173._12_4_ = auVar149._12_4_;
      auVar114 = auVar65 & auVar162 | auVar173;
      auVar114 = packssdw(auVar114,auVar114);
      auVar56._8_4_ = 0xffffffff;
      auVar56._0_8_ = 0xffffffffffffffff;
      auVar56._12_4_ = 0xffffffff;
      auVar114 = packssdw(auVar114 ^ auVar56,auVar114 ^ auVar56);
      auVar114 = packsswb(auVar114,auVar114);
      if ((auVar114._0_4_ >> 0x10 & 1) != 0) {
        *(char *)((long)&local_138 + uVar92 + 2) = cVar99 + '\x02';
      }
      auVar114 = pshufhw(auVar114,auVar162,0x84);
      auVar66._4_4_ = iVar172;
      auVar66._0_4_ = iVar172;
      auVar66._8_4_ = iVar176;
      auVar66._12_4_ = iVar176;
      auVar159 = pshufhw(auVar149,auVar66,0x84);
      auVar157 = pshufhw(auVar114,auVar173,0x84);
      auVar115._8_4_ = 0xffffffff;
      auVar115._0_8_ = 0xffffffffffffffff;
      auVar115._12_4_ = 0xffffffff;
      auVar115 = (auVar157 | auVar159 & auVar114) ^ auVar115;
      auVar114 = packssdw(auVar115,auVar115);
      auVar114 = packsswb(auVar114,auVar114);
      if ((auVar114._0_4_ >> 0x18 & 1) != 0) {
        *(char *)((long)&local_138 + uVar92 + 3) = cVar99 + '\x03';
      }
      auVar114 = auVar145 ^ _DAT_0093d220;
      auVar150._0_4_ = -(uint)(iVar90 < auVar114._0_4_);
      auVar150._4_4_ = -(uint)(iVar89 < auVar114._4_4_);
      auVar150._8_4_ = -(uint)(iVar84 < auVar114._8_4_);
      auVar150._12_4_ = -(uint)(iVar85 < auVar114._12_4_);
      auVar67._4_4_ = auVar150._0_4_;
      auVar67._0_4_ = auVar150._0_4_;
      auVar67._8_4_ = auVar150._8_4_;
      auVar67._12_4_ = auVar150._8_4_;
      auVar159 = pshuflw(auVar173,auVar67,0xe8);
      auVar116._0_4_ = -(uint)(auVar114._0_4_ == iVar90);
      auVar116._4_4_ = -(uint)(auVar114._4_4_ == iVar89);
      auVar116._8_4_ = -(uint)(auVar114._8_4_ == iVar84);
      auVar116._12_4_ = -(uint)(auVar114._12_4_ == iVar85);
      auVar163._4_4_ = auVar116._4_4_;
      auVar163._0_4_ = auVar116._4_4_;
      auVar163._8_4_ = auVar116._12_4_;
      auVar163._12_4_ = auVar116._12_4_;
      auVar114 = pshuflw(auVar116,auVar163,0xe8);
      auVar164._4_4_ = auVar150._4_4_;
      auVar164._0_4_ = auVar150._4_4_;
      auVar164._8_4_ = auVar150._12_4_;
      auVar164._12_4_ = auVar150._12_4_;
      auVar157 = pshuflw(auVar150,auVar164,0xe8);
      auVar57._8_4_ = 0xffffffff;
      auVar57._0_8_ = 0xffffffffffffffff;
      auVar57._12_4_ = 0xffffffff;
      auVar114 = packssdw(auVar114 & auVar159,(auVar157 | auVar114 & auVar159) ^ auVar57);
      auVar114 = packsswb(auVar114,auVar114);
      if ((auVar114 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        acStack_134[uVar92] = cVar99 + '\x04';
      }
      auVar68._4_4_ = auVar150._0_4_;
      auVar68._0_4_ = auVar150._0_4_;
      auVar68._8_4_ = auVar150._8_4_;
      auVar68._12_4_ = auVar150._8_4_;
      auVar164 = auVar163 & auVar68 | auVar164;
      auVar157 = packssdw(auVar164,auVar164);
      auVar58._8_4_ = 0xffffffff;
      auVar58._0_8_ = 0xffffffffffffffff;
      auVar58._12_4_ = 0xffffffff;
      auVar114 = packssdw(auVar114,auVar157 ^ auVar58);
      auVar114 = packsswb(auVar114,auVar114);
      if ((auVar114._4_2_ >> 8 & 1) != 0) {
        acStack_134[uVar92 + 1] = cVar99 + '\x05';
      }
      auVar114 = auVar144 ^ _DAT_0093d220;
      auVar151._0_4_ = -(uint)(iVar90 < auVar114._0_4_);
      auVar151._4_4_ = -(uint)(iVar89 < auVar114._4_4_);
      auVar151._8_4_ = -(uint)(iVar84 < auVar114._8_4_);
      auVar151._12_4_ = -(uint)(iVar85 < auVar114._12_4_);
      auVar165._4_4_ = auVar151._0_4_;
      auVar165._0_4_ = auVar151._0_4_;
      auVar165._8_4_ = auVar151._8_4_;
      auVar165._12_4_ = auVar151._8_4_;
      iVar172 = -(uint)(auVar114._4_4_ == iVar89);
      iVar176 = -(uint)(auVar114._12_4_ == iVar85);
      auVar69._4_4_ = iVar172;
      auVar69._0_4_ = iVar172;
      auVar69._8_4_ = iVar176;
      auVar69._12_4_ = iVar176;
      auVar174._4_4_ = auVar151._4_4_;
      auVar174._0_4_ = auVar151._4_4_;
      auVar174._8_4_ = auVar151._12_4_;
      auVar174._12_4_ = auVar151._12_4_;
      auVar114 = auVar69 & auVar165 | auVar174;
      auVar114 = packssdw(auVar114,auVar114);
      auVar59._8_4_ = 0xffffffff;
      auVar59._0_8_ = 0xffffffffffffffff;
      auVar59._12_4_ = 0xffffffff;
      auVar114 = packssdw(auVar114 ^ auVar59,auVar114 ^ auVar59);
      auVar114 = packsswb(auVar114,auVar114);
      if ((auVar114 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        acStack_134[uVar92 + 2] = cVar99 + '\x06';
      }
      auVar114 = pshufhw(auVar114,auVar165,0x84);
      auVar70._4_4_ = iVar172;
      auVar70._0_4_ = iVar172;
      auVar70._8_4_ = iVar176;
      auVar70._12_4_ = iVar176;
      auVar159 = pshufhw(auVar151,auVar70,0x84);
      auVar157 = pshufhw(auVar114,auVar174,0x84);
      auVar117._8_4_ = 0xffffffff;
      auVar117._0_8_ = 0xffffffffffffffff;
      auVar117._12_4_ = 0xffffffff;
      auVar117 = (auVar157 | auVar159 & auVar114) ^ auVar117;
      auVar114 = packssdw(auVar117,auVar117);
      auVar114 = packsswb(auVar114,auVar114);
      if ((auVar114._6_2_ >> 8 & 1) != 0) {
        acStack_134[uVar92 + 3] = cVar99 + '\a';
      }
      auVar114 = auVar142 ^ _DAT_0093d220;
      auVar152._0_4_ = -(uint)(iVar90 < auVar114._0_4_);
      auVar152._4_4_ = -(uint)(iVar89 < auVar114._4_4_);
      auVar152._8_4_ = -(uint)(iVar84 < auVar114._8_4_);
      auVar152._12_4_ = -(uint)(iVar85 < auVar114._12_4_);
      auVar71._4_4_ = auVar152._0_4_;
      auVar71._0_4_ = auVar152._0_4_;
      auVar71._8_4_ = auVar152._8_4_;
      auVar71._12_4_ = auVar152._8_4_;
      auVar159 = pshuflw(auVar174,auVar71,0xe8);
      auVar118._0_4_ = -(uint)(auVar114._0_4_ == iVar90);
      auVar118._4_4_ = -(uint)(auVar114._4_4_ == iVar89);
      auVar118._8_4_ = -(uint)(auVar114._8_4_ == iVar84);
      auVar118._12_4_ = -(uint)(auVar114._12_4_ == iVar85);
      auVar166._4_4_ = auVar118._4_4_;
      auVar166._0_4_ = auVar118._4_4_;
      auVar166._8_4_ = auVar118._12_4_;
      auVar166._12_4_ = auVar118._12_4_;
      auVar114 = pshuflw(auVar118,auVar166,0xe8);
      auVar167._4_4_ = auVar152._4_4_;
      auVar167._0_4_ = auVar152._4_4_;
      auVar167._8_4_ = auVar152._12_4_;
      auVar167._12_4_ = auVar152._12_4_;
      auVar157 = pshuflw(auVar152,auVar167,0xe8);
      auVar153._8_4_ = 0xffffffff;
      auVar153._0_8_ = 0xffffffffffffffff;
      auVar153._12_4_ = 0xffffffff;
      auVar153 = (auVar157 | auVar114 & auVar159) ^ auVar153;
      auVar157 = packssdw(auVar153,auVar153);
      auVar114 = packsswb(auVar114 & auVar159,auVar157);
      if ((auVar114 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        acStack_134[uVar92 + 4] = cVar99 + '\b';
      }
      auVar72._4_4_ = auVar152._0_4_;
      auVar72._0_4_ = auVar152._0_4_;
      auVar72._8_4_ = auVar152._8_4_;
      auVar72._12_4_ = auVar152._8_4_;
      auVar167 = auVar166 & auVar72 | auVar167;
      auVar157 = packssdw(auVar167,auVar167);
      auVar60._8_4_ = 0xffffffff;
      auVar60._0_8_ = 0xffffffffffffffff;
      auVar60._12_4_ = 0xffffffff;
      auVar157 = packssdw(auVar157 ^ auVar60,auVar157 ^ auVar60);
      auVar114 = packsswb(auVar114,auVar157);
      if ((auVar114._8_2_ >> 8 & 1) != 0) {
        acStack_134[uVar92 + 5] = cVar99 + '\t';
      }
      auVar114 = auVar134 ^ _DAT_0093d220;
      auVar154._0_4_ = -(uint)(iVar90 < auVar114._0_4_);
      auVar154._4_4_ = -(uint)(iVar89 < auVar114._4_4_);
      auVar154._8_4_ = -(uint)(iVar84 < auVar114._8_4_);
      auVar154._12_4_ = -(uint)(iVar85 < auVar114._12_4_);
      auVar168._4_4_ = auVar154._0_4_;
      auVar168._0_4_ = auVar154._0_4_;
      auVar168._8_4_ = auVar154._8_4_;
      auVar168._12_4_ = auVar154._8_4_;
      iVar172 = -(uint)(auVar114._4_4_ == iVar89);
      iVar176 = -(uint)(auVar114._12_4_ == iVar85);
      auVar73._4_4_ = iVar172;
      auVar73._0_4_ = iVar172;
      auVar73._8_4_ = iVar176;
      auVar73._12_4_ = iVar176;
      auVar175._4_4_ = auVar154._4_4_;
      auVar175._0_4_ = auVar154._4_4_;
      auVar175._8_4_ = auVar154._12_4_;
      auVar175._12_4_ = auVar154._12_4_;
      auVar114 = auVar73 & auVar168 | auVar175;
      auVar114 = packssdw(auVar114,auVar114);
      auVar61._8_4_ = 0xffffffff;
      auVar61._0_8_ = 0xffffffffffffffff;
      auVar61._12_4_ = 0xffffffff;
      auVar114 = packssdw(auVar114 ^ auVar61,auVar114 ^ auVar61);
      auVar114 = packsswb(auVar114,auVar114);
      if ((auVar114 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        acStack_134[uVar92 + 6] = cVar99 + '\n';
      }
      auVar114 = pshufhw(auVar114,auVar168,0x84);
      auVar74._4_4_ = iVar172;
      auVar74._0_4_ = iVar172;
      auVar74._8_4_ = iVar176;
      auVar74._12_4_ = iVar176;
      auVar159 = pshufhw(auVar154,auVar74,0x84);
      auVar157 = pshufhw(auVar114,auVar175,0x84);
      auVar119._8_4_ = 0xffffffff;
      auVar119._0_8_ = 0xffffffffffffffff;
      auVar119._12_4_ = 0xffffffff;
      auVar119 = (auVar157 | auVar159 & auVar114) ^ auVar119;
      auVar114 = packssdw(auVar119,auVar119);
      auVar114 = packsswb(auVar114,auVar114);
      if ((auVar114._10_2_ >> 8 & 1) != 0) {
        acStack_134[uVar92 + 7] = cVar99 + '\v';
      }
      auVar114 = auVar129 ^ _DAT_0093d220;
      auVar155._0_4_ = -(uint)(iVar90 < auVar114._0_4_);
      auVar155._4_4_ = -(uint)(iVar89 < auVar114._4_4_);
      auVar155._8_4_ = -(uint)(iVar84 < auVar114._8_4_);
      auVar155._12_4_ = -(uint)(iVar85 < auVar114._12_4_);
      auVar75._4_4_ = auVar155._0_4_;
      auVar75._0_4_ = auVar155._0_4_;
      auVar75._8_4_ = auVar155._8_4_;
      auVar75._12_4_ = auVar155._8_4_;
      auVar159 = pshuflw(auVar175,auVar75,0xe8);
      auVar120._0_4_ = -(uint)(auVar114._0_4_ == iVar90);
      auVar120._4_4_ = -(uint)(auVar114._4_4_ == iVar89);
      auVar120._8_4_ = -(uint)(auVar114._8_4_ == iVar84);
      auVar120._12_4_ = -(uint)(auVar114._12_4_ == iVar85);
      auVar169._4_4_ = auVar120._4_4_;
      auVar169._0_4_ = auVar120._4_4_;
      auVar169._8_4_ = auVar120._12_4_;
      auVar169._12_4_ = auVar120._12_4_;
      auVar114 = pshuflw(auVar120,auVar169,0xe8);
      auVar170._4_4_ = auVar155._4_4_;
      auVar170._0_4_ = auVar155._4_4_;
      auVar170._8_4_ = auVar155._12_4_;
      auVar170._12_4_ = auVar155._12_4_;
      auVar157 = pshuflw(auVar155,auVar170,0xe8);
      auVar62._8_4_ = 0xffffffff;
      auVar62._0_8_ = 0xffffffffffffffff;
      auVar62._12_4_ = 0xffffffff;
      auVar114 = packssdw(auVar114 & auVar159,(auVar157 | auVar114 & auVar159) ^ auVar62);
      auVar114 = packsswb(auVar114,auVar114);
      if ((auVar114 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        acStack_134[uVar92 + 8] = cVar99 + '\f';
      }
      auVar76._4_4_ = auVar155._0_4_;
      auVar76._0_4_ = auVar155._0_4_;
      auVar76._8_4_ = auVar155._8_4_;
      auVar76._12_4_ = auVar155._8_4_;
      auVar170 = auVar169 & auVar76 | auVar170;
      auVar157 = packssdw(auVar170,auVar170);
      auVar63._8_4_ = 0xffffffff;
      auVar63._0_8_ = 0xffffffffffffffff;
      auVar63._12_4_ = 0xffffffff;
      auVar114 = packssdw(auVar114,auVar157 ^ auVar63);
      auVar114 = packsswb(auVar114,auVar114);
      if ((auVar114._12_2_ >> 8 & 1) != 0) {
        acStack_134[uVar92 + 9] = cVar99 + '\r';
      }
      auVar114 = auVar131 ^ _DAT_0093d220;
      auVar156._0_4_ = -(uint)(iVar90 < auVar114._0_4_);
      auVar156._4_4_ = -(uint)(iVar89 < auVar114._4_4_);
      auVar156._8_4_ = -(uint)(iVar84 < auVar114._8_4_);
      auVar156._12_4_ = -(uint)(iVar85 < auVar114._12_4_);
      auVar171._4_4_ = auVar156._0_4_;
      auVar171._0_4_ = auVar156._0_4_;
      auVar171._8_4_ = auVar156._8_4_;
      auVar171._12_4_ = auVar156._8_4_;
      iVar90 = -(uint)(auVar114._4_4_ == iVar89);
      iVar89 = -(uint)(auVar114._12_4_ == iVar85);
      auVar158._4_4_ = iVar90;
      auVar158._0_4_ = iVar90;
      auVar158._8_4_ = iVar89;
      auVar158._12_4_ = iVar89;
      auVar121._4_4_ = auVar156._4_4_;
      auVar121._0_4_ = auVar156._4_4_;
      auVar121._8_4_ = auVar156._12_4_;
      auVar121._12_4_ = auVar156._12_4_;
      auVar121 = auVar158 & auVar171 | auVar121;
      auVar114 = packssdw(auVar121,auVar121);
      auVar64._8_4_ = 0xffffffff;
      auVar64._0_8_ = 0xffffffffffffffff;
      auVar64._12_4_ = 0xffffffff;
      auVar114 = packssdw(auVar114 ^ auVar64,auVar114 ^ auVar64);
      auVar114 = packsswb(auVar114,auVar114);
      if ((auVar114 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        acStack_134[uVar92 + 10] = cVar99 + '\x0e';
      }
      auVar114 = pshufhw(auVar114,auVar171,0x84);
      in_XMM11 = pshufhw(auVar156,auVar158,0x84);
      in_XMM11 = in_XMM11 & auVar114;
      auVar77._4_4_ = auVar156._4_4_;
      auVar77._0_4_ = auVar156._4_4_;
      auVar77._8_4_ = auVar156._12_4_;
      auVar77._12_4_ = auVar156._12_4_;
      auVar114 = pshufhw(auVar114,auVar77,0x84);
      auVar122._8_4_ = 0xffffffff;
      auVar122._0_8_ = 0xffffffffffffffff;
      auVar122._12_4_ = 0xffffffff;
      auVar122 = (auVar114 | in_XMM11) ^ auVar122;
      auVar114 = packssdw(auVar122,auVar122);
      auVar114 = packsswb(auVar114,auVar114);
      if ((auVar114._14_2_ >> 8 & 1) != 0) {
        acStack_134[uVar92 + 0xb] = cVar99 + '\x0f';
      }
      uVar92 = uVar92 + 0x10;
      lVar87 = (long)DAT_009b6400;
      lVar128 = auVar147._8_8_;
      auVar147._0_8_ = auVar147._0_8_ + lVar87;
      lVar102 = DAT_009b6400._8_8_;
      auVar147._8_8_ = lVar128 + lVar102;
      lVar128 = auVar146._8_8_;
      auVar146._0_8_ = auVar146._0_8_ + lVar87;
      auVar146._8_8_ = lVar128 + lVar102;
      lVar128 = auVar145._8_8_;
      auVar145._0_8_ = auVar145._0_8_ + lVar87;
      auVar145._8_8_ = lVar128 + lVar102;
      lVar128 = auVar144._8_8_;
      auVar144._0_8_ = auVar144._0_8_ + lVar87;
      auVar144._8_8_ = lVar128 + lVar102;
      lVar128 = auVar142._8_8_;
      auVar142._0_8_ = auVar142._0_8_ + lVar87;
      auVar142._8_8_ = lVar128 + lVar102;
      lVar128 = auVar134._8_8_;
      auVar134._0_8_ = auVar134._0_8_ + lVar87;
      auVar134._8_8_ = lVar128 + lVar102;
      lVar128 = auVar129._8_8_;
      auVar129._0_8_ = auVar129._0_8_ + lVar87;
      auVar129._8_8_ = lVar128 + lVar102;
      lVar128 = auVar131._8_8_;
      auVar131._0_8_ = auVar131._0_8_ + lVar87;
      auVar131._8_8_ = lVar128 + lVar102;
      auVar114 = _DAT_009b6400;
    } while ((uVar83 + 0xf & 0xfffffff0) != uVar92);
  }
  uVar91 = s->nblock;
  local_1c0 = pUVar107;
  if ((int)uVar91 < 1) {
    iVar90 = 0;
  }
  else {
    lVar87 = 0;
    iVar89 = 0;
    iVar90 = 0;
    UVar96 = (UChar)local_138;
    do {
      UVar78 = local_138._1_1_;
      UVar4 = s->unseqToSeq
              [pUVar105[(int)(pUVar88[lVar87] + ((int)(pUVar88[lVar87] - 1) >> 0x1f & uVar91) + -1)]
              ];
      if (UVar96 == UVar4) {
        iVar89 = iVar89 + 1;
      }
      else {
        if (0 < iVar89) {
          uVar91 = iVar89 - 1;
          pUVar101 = pUVar107 + iVar90;
          while( true ) {
            iVar90 = iVar90 + 1;
            bVar113 = (uVar91 & 1) != 0;
            if (bVar113) {
              s->mtfFreq[1] = s->mtfFreq[1] + 1;
            }
            else {
              s->mtfFreq[0] = s->mtfFreq[0] + 1;
            }
            *pUVar101 = (ushort)bVar113;
            if ((int)uVar91 < 2) break;
            uVar91 = uVar91 - 2 >> 1;
            pUVar101 = pUVar101 + 1;
          }
          iVar89 = 0;
        }
        local_138._1_1_ = (UChar)local_138;
        puVar79 = &local_138;
        while (UVar4 != UVar78) {
          UVar96 = *(UChar *)((long)puVar79 + 2);
          *(UChar *)((long)puVar79 + 2) = UVar78;
          UVar78 = UVar96;
          puVar79 = (undefined4 *)((long)puVar79 + 1);
        }
        iVar84 = ((int)(undefined4 *)((long)puVar79 + 1) - (int)&local_138) + 1;
        pUVar107[iVar90] = (UInt16)iVar84;
        s->mtfFreq[iVar84] = s->mtfFreq[iVar84] + 1;
        iVar90 = iVar90 + 1;
        uVar91 = s->nblock;
        local_138._0_1_ = UVar4;
      }
      lVar87 = lVar87 + 1;
      UVar96 = UVar4;
    } while (lVar87 < (int)uVar91);
    pUVar107 = local_1c0;
    if (0 < iVar89) {
      uVar91 = iVar89 - 1;
      puVar95 = pUVar107 + iVar90;
      while( true ) {
        iVar90 = iVar90 + 1;
        bVar113 = (uVar91 & 1) != 0;
        if (bVar113) {
          s->mtfFreq[1] = s->mtfFreq[1] + 1;
        }
        else {
          s->mtfFreq[0] = s->mtfFreq[0] + 1;
        }
        *puVar95 = (ushort)bVar113;
        if ((int)uVar91 < 2) break;
        uVar91 = uVar91 - 2 >> 1;
        puVar95 = puVar95 + 1;
      }
    }
  }
  pUVar107[iVar90] = (short)uVar83 + 1;
  s->mtfFreq[(long)(int)uVar83 + 1] = s->mtfFreq[(long)(int)uVar83 + 1] + 1;
  s->nMTF = iVar90 + 1U;
  if (2 < s->verbosity) {
    fprintf(_stderr,"      %d in block, %d after MTF & 1-2 coding, %d+2 syms in use\n",
            (ulong)(uint)s->nblock,(ulong)(iVar90 + 1U),(ulong)(uint)s->nInUse);
  }
  iVar90 = s->nInUse;
  uVar83 = iVar90 + 2;
  sVar104 = 1;
  if (1 < (int)uVar83) {
    sVar104 = (size_t)uVar83;
  }
  paUVar1 = s->len;
  lVar87 = 0;
  do {
    if (-2 < iVar90) {
      memset(*paUVar1 + lVar87,0xf,sVar104);
    }
    lVar87 = lVar87 + 0x102;
  } while (lVar87 != 0x60c);
  uVar91 = s->nMTF;
  if ((int)uVar91 < 1) {
    BZ2_bz__AssertH__fail(0xbb9);
    uVar91 = s->nMTF;
  }
  uVar92 = 0;
  if ((int)uVar91 < 200) {
    uVar86 = 2;
LAB_004a67fe:
    local_1c8 = 0;
  }
  else {
    if (uVar91 < 600) {
      uVar86 = 3;
      goto LAB_004a67fe;
    }
    if (uVar91 < 0x4b0) {
      uVar86 = 4;
      goto LAB_004a67fe;
    }
    local_1c8 = (ulong)(0x95f < uVar91);
    uVar86 = (0x95f < uVar91) + 5;
  }
  uVar110 = (ulong)uVar86;
  uVar97 = (ulong)((int)sVar104 + 1U & 0xfffffffe);
  lVar87 = sVar104 - 1;
  auVar143._8_4_ = (int)lVar87;
  auVar143._0_8_ = lVar87;
  auVar143._12_4_ = (int)((ulong)lVar87 >> 0x20);
  pUVar105 = s->selectorMtf + (ulong)(uVar86 * 0x102) + 0x4551;
  auVar143 = auVar143 ^ _DAT_0093d220;
  uVar103 = uVar110;
  auVar114 = _DAT_0093d210;
  auVar131 = _DAT_0093d220;
  local_1b8 = uVar83;
  local_190 = sVar104;
  local_180 = uVar97;
  local_168 = auVar143;
  do {
    iVar84 = (int)uVar91 / (int)uVar103;
    iVar89 = (int)uVar92;
    uVar83 = iVar89 - 1;
    uVar109 = (ulong)uVar83;
    uVar112 = 0;
    if ((0 < iVar84) && ((int)uVar83 <= iVar90)) {
      lVar87 = (long)(int)uVar83 << 0x20;
      uVar112 = 0;
      uVar108 = (long)(int)uVar83;
      do {
        lVar87 = lVar87 + 0x100000000;
        uVar83 = (int)uVar112 + s->mtfFreq[uVar108 + 1];
        uVar112 = (ulong)uVar83;
        uVar109 = uVar108 + 1;
        if ((long)iVar90 <= (long)uVar108) break;
        uVar108 = uVar109;
      } while ((int)uVar83 < iVar84);
      if (((iVar89 < (int)uVar109) && (uVar103 != 1 && uVar103 != uVar110)) &&
         ((uVar86 - (int)uVar103 & 0x80000001) == 1)) {
        uVar112 = (ulong)(uVar83 - *(int *)((long)s->mtfFreq + (lVar87 >> 0x1e)));
        uVar109 = (ulong)((int)uVar109 - 1);
      }
    }
    iVar84 = (int)uVar109;
    if (2 < s->verbosity) {
      local_1a8._0_4_ = uVar91;
      fprintf(_stderr,"      initial group %d, [%d .. %d], has %d syms (%4.1f%%)\n",
              ((double)(int)uVar112 * 100.0) / (double)s->nMTF,uVar103 & 0xffffffff,uVar92,
              uVar109 & 0xffffffff,uVar112);
      uVar97 = local_180;
      auVar143 = local_168;
      auVar114 = _DAT_0093d210;
      auVar131 = _DAT_0093d220;
      uVar91 = local_1a8._0_4_;
    }
    if (-2 < iVar90) {
      uVar92 = 0;
      auVar123 = auVar114;
      do {
        bVar113 = auVar143._0_4_ < SUB164(auVar123 ^ auVar131,0);
        iVar85 = SUB164(auVar123 ^ auVar131,4);
        iVar172 = auVar143._4_4_;
        if ((bool)(~(iVar172 < iVar85 || iVar85 == iVar172 && bVar113) & 1)) {
          UVar96 = '\0';
          if ((long)iVar84 < (long)uVar92) {
            UVar96 = '\x0f';
          }
          if ((long)uVar92 < (long)iVar89) {
            UVar96 = '\x0f';
          }
          pUVar105[uVar92 - 1] = UVar96;
        }
        if (iVar172 >= iVar85 && (iVar85 != iVar172 || !bVar113)) {
          UVar96 = '\0';
          if ((long)iVar84 <= (long)uVar92) {
            UVar96 = '\x0f';
          }
          if ((long)(uVar92 + 1) < (long)iVar89) {
            UVar96 = '\x0f';
          }
          pUVar105[uVar92] = UVar96;
        }
        uVar92 = uVar92 + 2;
        lVar87 = auVar123._8_8_;
        auVar123._0_8_ = auVar123._0_8_ + 2;
        auVar123._8_8_ = lVar87 + 2;
      } while (uVar97 != uVar92);
    }
    uVar91 = uVar91 - (int)uVar112;
    pUVar105 = pUVar105 + -0x102;
    uVar92 = (ulong)(iVar84 + 1);
    bVar113 = 1 < (long)uVar103;
    uVar103 = uVar103 - 1;
  } while (bVar113);
  paIVar2 = s->rfreq;
  local_148 = (size_t)(uVar86 * 4);
  local_168._0_8_ = local_190 * 4;
  local_180 = (ulong)(uVar86 * 2);
  bVar81 = -2 < iVar90 & (byte)local_1c8;
  local_150 = s->len_pack[0] + 2;
  local_140 = s->len;
  local_188 = 0;
  local_170 = uVar110;
  do {
    sVar104 = local_190;
    memset(&local_138,0,local_148);
    uVar92 = 0;
    do {
      while (iVar90 < -1) {
        uVar92 = uVar92 + 1;
        if (uVar92 == uVar110) goto LAB_004a6ba2;
      }
      memset(paIVar2 + uVar92,0,local_168._0_8_);
      uVar92 = uVar92 + 1;
    } while (uVar92 != uVar110);
    if (bVar81 != 0) {
      sVar93 = 0;
      pUVar88 = local_150;
      do {
        (*(UInt32 (*) [4])(pUVar88 + -2))[0] =
             (uint)s->len[0][sVar93] | (uint)s->len[1][sVar93] << 0x10;
        pUVar88[-1] = (uint)s->len[2][sVar93] | (uint)s->len[3][sVar93] << 0x10;
        *pUVar88 = (uint)s->len[4][sVar93] | (uint)s->len[5][sVar93] << 0x10;
        sVar93 = sVar93 + 1;
        pUVar88 = pUVar88 + 4;
      } while (sVar104 != sVar93);
    }
LAB_004a6ba2:
    iVar89 = s->nMTF;
    lVar87 = 0;
    if (0 < iVar89) {
      iVar84 = 0;
      do {
        local_1a8._0_8_ = lVar87;
        memset(&local_1b4,0,local_180);
        paUVar106 = local_140;
        uVar110 = local_170;
        iVar85 = iVar89 + -1;
        if (iVar84 + 0x31 < iVar89) {
          iVar85 = iVar84 + 0x31;
        }
        bVar82 = iVar85 - iVar84 == 0x31 & (byte)local_1c8;
        uVar80 = local_1a8._0_8_;
        if (bVar82 == 0) {
          if (iVar84 <= iVar85) {
            lVar87 = (long)iVar84;
            do {
              pUVar105 = *paUVar106 + local_1c0[lVar87];
              uVar92 = 0;
              do {
                psVar3 = (short *)((long)&local_1b4 + uVar92 * 2);
                *psVar3 = *psVar3 + (ushort)*pUVar105;
                uVar92 = uVar92 + 1;
                pUVar105 = pUVar105 + 0x102;
              } while (uVar110 != uVar92);
              lVar87 = lVar87 + 1;
            } while (iVar85 + 1 != (int)lVar87);
          }
        }
        else {
          uVar6 = local_1c0[iVar84];
          uVar7 = local_1c0[(long)iVar84 + 1];
          uVar8 = local_1c0[(long)iVar84 + 2];
          uVar9 = local_1c0[(long)iVar84 + 3];
          uVar10 = local_1c0[(long)iVar84 + 4];
          uVar11 = local_1c0[(long)iVar84 + 5];
          uVar12 = local_1c0[(long)iVar84 + 6];
          uVar13 = local_1c0[(long)iVar84 + 7];
          uVar14 = local_1c0[(long)iVar84 + 8];
          uVar15 = local_1c0[(long)iVar84 + 9];
          uVar16 = local_1c0[(long)iVar84 + 10];
          uVar17 = local_1c0[(long)iVar84 + 0xb];
          uVar18 = local_1c0[(long)iVar84 + 0xc];
          uVar19 = local_1c0[(long)iVar84 + 0xd];
          uVar20 = local_1c0[(long)iVar84 + 0xe];
          uVar21 = local_1c0[(long)iVar84 + 0xf];
          uVar22 = local_1c0[(long)iVar84 + 0x10];
          uVar23 = local_1c0[(long)iVar84 + 0x11];
          uVar24 = local_1c0[(long)iVar84 + 0x12];
          uVar25 = local_1c0[(long)iVar84 + 0x13];
          uVar26 = local_1c0[(long)iVar84 + 0x14];
          uVar27 = local_1c0[(long)iVar84 + 0x15];
          uVar28 = local_1c0[(long)iVar84 + 0x16];
          uVar29 = local_1c0[(long)iVar84 + 0x17];
          uVar30 = local_1c0[(long)iVar84 + 0x18];
          uVar31 = local_1c0[(long)iVar84 + 0x19];
          uVar32 = local_1c0[(long)iVar84 + 0x1a];
          uVar33 = local_1c0[(long)iVar84 + 0x1b];
          uVar34 = local_1c0[(long)iVar84 + 0x1c];
          uVar35 = local_1c0[(long)iVar84 + 0x1d];
          uVar36 = local_1c0[(long)iVar84 + 0x1e];
          uVar37 = local_1c0[(long)iVar84 + 0x1f];
          uVar38 = local_1c0[(long)iVar84 + 0x20];
          uVar39 = local_1c0[(long)iVar84 + 0x21];
          uVar40 = local_1c0[(long)iVar84 + 0x22];
          uVar41 = local_1c0[(long)iVar84 + 0x23];
          uVar42 = local_1c0[(long)iVar84 + 0x24];
          uVar43 = local_1c0[(long)iVar84 + 0x25];
          uVar44 = local_1c0[(long)iVar84 + 0x26];
          uVar45 = local_1c0[(long)iVar84 + 0x27];
          uVar46 = local_1c0[(long)iVar84 + 0x28];
          uVar47 = local_1c0[(long)iVar84 + 0x29];
          uVar48 = local_1c0[(long)iVar84 + 0x2a];
          uVar49 = local_1c0[(long)iVar84 + 0x2b];
          uVar50 = local_1c0[(long)iVar84 + 0x2c];
          uVar51 = local_1c0[(long)iVar84 + 0x2d];
          uVar52 = local_1c0[(long)iVar84 + 0x2e];
          uVar53 = local_1c0[(long)iVar84 + 0x2f];
          uVar54 = local_1c0[(long)iVar84 + 0x30];
          uVar55 = local_1c0[(long)iVar84 + 0x31];
          local_1b4 = s->len_pack[uVar7][0] + s->len_pack[uVar6][0] + s->len_pack[uVar8][0] +
                      s->len_pack[uVar9][0] + s->len_pack[uVar10][0] + s->len_pack[uVar11][0] +
                      s->len_pack[uVar12][0] + s->len_pack[uVar13][0] + s->len_pack[uVar14][0] +
                      s->len_pack[uVar15][0] + s->len_pack[uVar16][0] + s->len_pack[uVar17][0] +
                      s->len_pack[uVar18][0] + s->len_pack[uVar19][0] + s->len_pack[uVar20][0] +
                      s->len_pack[uVar21][0] + s->len_pack[uVar22][0] + s->len_pack[uVar23][0] +
                      s->len_pack[uVar24][0] + s->len_pack[uVar25][0] + s->len_pack[uVar26][0] +
                      s->len_pack[uVar27][0] + s->len_pack[uVar28][0] + s->len_pack[uVar29][0] +
                      s->len_pack[uVar30][0] + s->len_pack[uVar31][0] + s->len_pack[uVar32][0] +
                      s->len_pack[uVar33][0] + s->len_pack[uVar34][0] + s->len_pack[uVar35][0] +
                      s->len_pack[uVar36][0] + s->len_pack[uVar37][0] + s->len_pack[uVar38][0] +
                      s->len_pack[uVar39][0] + s->len_pack[uVar40][0] + s->len_pack[uVar41][0] +
                      s->len_pack[uVar42][0] + s->len_pack[uVar43][0] + s->len_pack[uVar44][0] +
                      s->len_pack[uVar45][0] + s->len_pack[uVar46][0] + s->len_pack[uVar47][0] +
                      s->len_pack[uVar48][0] + s->len_pack[uVar49][0] + s->len_pack[uVar50][0] +
                      s->len_pack[uVar51][0] + s->len_pack[uVar52][0] + s->len_pack[uVar53][0] +
                      s->len_pack[uVar54][0] + s->len_pack[uVar55][0];
          local_1b0 = s->len_pack[uVar7][1] + s->len_pack[uVar6][1] + s->len_pack[uVar8][1] +
                      s->len_pack[uVar9][1] + s->len_pack[uVar10][1] + s->len_pack[uVar11][1] +
                      s->len_pack[uVar12][1] + s->len_pack[uVar13][1] + s->len_pack[uVar14][1] +
                      s->len_pack[uVar15][1] + s->len_pack[uVar16][1] + s->len_pack[uVar17][1] +
                      s->len_pack[uVar18][1] + s->len_pack[uVar19][1] + s->len_pack[uVar20][1] +
                      s->len_pack[uVar21][1] + s->len_pack[uVar22][1] + s->len_pack[uVar23][1] +
                      s->len_pack[uVar24][1] + s->len_pack[uVar25][1] + s->len_pack[uVar26][1] +
                      s->len_pack[uVar27][1] + s->len_pack[uVar28][1] + s->len_pack[uVar29][1] +
                      s->len_pack[uVar30][1] + s->len_pack[uVar31][1] + s->len_pack[uVar32][1] +
                      s->len_pack[uVar33][1] + s->len_pack[uVar34][1] + s->len_pack[uVar35][1] +
                      s->len_pack[uVar36][1] + s->len_pack[uVar37][1] + s->len_pack[uVar38][1] +
                      s->len_pack[uVar39][1] + s->len_pack[uVar40][1] + s->len_pack[uVar41][1] +
                      s->len_pack[uVar42][1] + s->len_pack[uVar43][1] + s->len_pack[uVar44][1] +
                      s->len_pack[uVar45][1] + s->len_pack[uVar46][1] + s->len_pack[uVar47][1] +
                      s->len_pack[uVar48][1] + s->len_pack[uVar49][1] + s->len_pack[uVar50][1] +
                      s->len_pack[uVar51][1] + s->len_pack[uVar52][1] + s->len_pack[uVar53][1] +
                      s->len_pack[uVar54][1] + s->len_pack[uVar55][1];
          local_1ac = s->len_pack[uVar7][2] + s->len_pack[uVar6][2] + s->len_pack[uVar8][2] +
                      s->len_pack[uVar9][2] + s->len_pack[uVar10][2] + s->len_pack[uVar11][2] +
                      s->len_pack[uVar12][2] + s->len_pack[uVar13][2] + s->len_pack[uVar14][2] +
                      s->len_pack[uVar15][2] + s->len_pack[uVar16][2] + s->len_pack[uVar17][2] +
                      s->len_pack[uVar18][2] + s->len_pack[uVar19][2] + s->len_pack[uVar20][2] +
                      s->len_pack[uVar21][2] + s->len_pack[uVar22][2] + s->len_pack[uVar23][2] +
                      s->len_pack[uVar24][2] + s->len_pack[uVar25][2] + s->len_pack[uVar26][2] +
                      s->len_pack[uVar27][2] + s->len_pack[uVar28][2] + s->len_pack[uVar29][2] +
                      s->len_pack[uVar30][2] + s->len_pack[uVar31][2] + s->len_pack[uVar32][2] +
                      s->len_pack[uVar33][2] + s->len_pack[uVar34][2] + s->len_pack[uVar35][2] +
                      s->len_pack[uVar36][2] + s->len_pack[uVar37][2] + s->len_pack[uVar38][2] +
                      s->len_pack[uVar39][2] + s->len_pack[uVar40][2] + s->len_pack[uVar41][2] +
                      s->len_pack[uVar42][2] + s->len_pack[uVar43][2] + s->len_pack[uVar44][2] +
                      s->len_pack[uVar45][2] + s->len_pack[uVar46][2] + s->len_pack[uVar47][2] +
                      s->len_pack[uVar48][2] + s->len_pack[uVar49][2] + s->len_pack[uVar50][2] +
                      s->len_pack[uVar51][2] + s->len_pack[uVar52][2] + s->len_pack[uVar53][2] +
                      s->len_pack[uVar54][2] + s->len_pack[uVar55][2];
        }
        uVar92 = 0xffffffff;
        uVar97 = 0;
        uVar83 = 999999999;
        do {
          uVar6 = *(ushort *)((long)&local_1b4 + uVar97 * 2);
          uVar91 = (uint)uVar6;
          if (uVar83 < uVar6) {
            uVar91 = uVar83;
          }
          if (uVar6 < uVar83) {
            uVar92 = uVar97 & 0xffffffff;
          }
          uVar97 = uVar97 + 1;
          uVar83 = uVar91;
        } while (uVar110 != uVar97);
        iVar89 = (int)uVar92;
        (&local_138)[iVar89] = (&local_138)[iVar89] + 1;
        s->selector[uVar80] = (UChar)uVar92;
        if (bVar82 == 0) {
          if (iVar84 <= iVar85) {
            lVar87 = 0;
            do {
              paIVar2[iVar89][local_1c0[iVar84 + lVar87]] =
                   paIVar2[iVar89][local_1c0[iVar84 + lVar87]] + 1;
              lVar87 = lVar87 + 1;
            } while ((iVar85 - iVar84) + 1 != (int)lVar87);
          }
        }
        else {
          paIVar2[iVar89][local_1c0[iVar84]] = paIVar2[iVar89][local_1c0[iVar84]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 1]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 1]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 2]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 2]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 3]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 3]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 4]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 4]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 5]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 5]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 6]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 6]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 7]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 7]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 8]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 8]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 9]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 9]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 10]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 10]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0xb]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0xb]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0xc]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0xc]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0xd]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0xd]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0xe]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0xe]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0xf]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0xf]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x10]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x10]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x11]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x11]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x12]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x12]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x13]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x13]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x14]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x14]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x15]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x15]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x16]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x16]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x17]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x17]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x18]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x18]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x19]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x19]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x1a]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x1a]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x1b]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x1b]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x1c]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x1c]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x1d]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x1d]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x1e]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x1e]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x1f]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x1f]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x20]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x20]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x21]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x21]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x22]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x22]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x23]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x23]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x24]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x24]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x25]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x25]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x26]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x26]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x27]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x27]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x28]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x28]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x29]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x29]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x2a]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x2a]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x2b]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x2b]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x2c]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x2c]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x2d]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x2d]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x2e]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x2e]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x2f]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x2f]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x30]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x30]] + 1;
          paIVar2[iVar89][local_1c0[(long)iVar84 + 0x31]] =
               paIVar2[iVar89][local_1c0[(long)iVar84 + 0x31]] + 1;
        }
        lVar87 = uVar80 + 1;
        iVar84 = iVar85 + 1;
        iVar89 = s->nMTF;
      } while (iVar84 < iVar89);
    }
    local_1a8._0_8_ = lVar87;
    freq = paIVar2;
    uVar92 = uVar110;
    paUVar106 = paUVar1;
    if (2 < s->verbosity) {
      BZ2_compressBlock_cold_1();
    }
    do {
      BZ2_hbMakeCodeLengths(*paUVar106,*freq,local_1b8,0x11);
      uVar92 = uVar92 - 1;
      freq = freq + 1;
      paUVar106 = paUVar106 + 1;
    } while (uVar92 != 0);
    uVar83 = (int)local_188 + 1;
    local_188 = (ulong)uVar83;
  } while (uVar83 != 4);
  uVar80 = local_1a8._0_8_;
  iVar89 = local_1a8._0_4_;
  if (0x4652 < iVar89) {
    BZ2_bz__AssertH__fail(0xbbb);
  }
  lVar87 = uVar110 - 1;
  auVar125._8_4_ = (int)lVar87;
  auVar125._0_8_ = lVar87;
  auVar125._12_4_ = (int)((ulong)lVar87 >> 0x20);
  auVar125 = auVar125 ^ _DAT_0093d220;
  iVar84 = auVar125._0_4_;
  iVar85 = auVar125._4_4_;
  iVar172 = auVar125._8_4_;
  iVar176 = auVar125._12_4_;
  auVar135._0_4_ = -(uint)(iVar84 < -0x80000000);
  auVar135._4_4_ = -(uint)(iVar84 < -0x80000000);
  auVar135._8_4_ = -(uint)(iVar172 < -0x7fffffff);
  auVar135._12_4_ = -(uint)(iVar172 < -0x7fffffff);
  auVar130._0_4_ = -(uint)(iVar85 == -0x80000000);
  auVar130._4_4_ = -(uint)(iVar85 == -0x80000000);
  auVar130._8_4_ = -(uint)(iVar176 == -0x80000000);
  auVar130._12_4_ = -(uint)(iVar176 == -0x80000000);
  auVar130 = auVar130 & auVar135;
  auVar114 = pshuflw(auVar143,auVar130,0xe8);
  auVar136._8_4_ = 0xffffffff;
  auVar136._0_8_ = 0xffffffffffffffff;
  auVar136._12_4_ = 0xffffffff;
  auVar114 = packssdw(auVar114 ^ auVar136,auVar114 ^ auVar136);
  if ((auVar114 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_1d8[0] = '\0';
  }
  auVar131 = packssdw(auVar130,auVar130);
  auVar131 = packssdw(auVar131 ^ auVar136,auVar131 ^ auVar136);
  if ((auVar131._0_4_ >> 0x10 & 1) != 0) {
    local_1d8[1] = 1;
  }
  auVar137._0_4_ = -(uint)(iVar84 < -0x7ffffffe);
  auVar137._4_4_ = -(uint)(iVar84 < -0x7ffffffe);
  auVar137._8_4_ = -(uint)(iVar172 < -0x7ffffffd);
  auVar137._12_4_ = -(uint)(iVar172 < -0x7ffffffd);
  auVar132._0_4_ = -(uint)(iVar85 == -0x80000000);
  auVar132._4_4_ = -(uint)(iVar85 == -0x80000000);
  auVar132._8_4_ = -(uint)(iVar176 == -0x80000000);
  auVar132._12_4_ = -(uint)(iVar176 == -0x80000000);
  auVar132 = auVar132 & auVar137;
  auVar114 = packssdw(auVar114,auVar132);
  auVar138._8_4_ = 0xffffffff;
  auVar138._0_8_ = 0xffffffffffffffff;
  auVar138._12_4_ = 0xffffffff;
  auVar114 = packssdw(auVar114 ^ auVar138,auVar114 ^ auVar138);
  if ((auVar114 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
    local_1d8[2] = 2;
  }
  auVar131 = pshufhw(auVar132,auVar132,0x84);
  auVar131 = packssdw(auVar131 ^ auVar138,auVar131 ^ auVar138);
  if ((auVar131 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
    local_1d8[3] = 3;
  }
  auVar139._0_4_ = -(uint)(iVar84 < -0x7ffffffc);
  auVar139._4_4_ = -(uint)(iVar84 < -0x7ffffffc);
  auVar139._8_4_ = -(uint)(iVar172 < -0x7ffffffb);
  auVar139._12_4_ = -(uint)(iVar172 < -0x7ffffffb);
  auVar133._0_4_ = -(uint)(iVar85 == -0x80000000);
  auVar133._4_4_ = -(uint)(iVar85 == -0x80000000);
  auVar133._8_4_ = -(uint)(iVar176 == -0x80000000);
  auVar133._12_4_ = -(uint)(iVar176 == -0x80000000);
  auVar133 = auVar133 & auVar139;
  auVar114 = pshuflw(auVar114,auVar133,0xe8);
  auVar140._8_4_ = 0xffffffff;
  auVar140._0_8_ = 0xffffffffffffffff;
  auVar140._12_4_ = 0xffffffff;
  auVar114 = packssdw(auVar114 ^ auVar140,auVar114 ^ auVar140);
  if ((auVar114 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_1d8[4] = 4;
  }
  auVar114 = packssdw(auVar133,auVar133);
  auVar114 = packssdw(auVar114 ^ auVar140,auVar114 ^ auVar140);
  if ((auVar114 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
    local_1d8[5] = 5;
  }
  auVar141._0_4_ = -(uint)(iVar84 < (int)DAT_009d2b80);
  auVar141._4_4_ = -(uint)(iVar84 < (int)DAT_009d2b80);
  auVar141._8_4_ = -(uint)(iVar172 < DAT_009d2b80._8_4_);
  auVar141._12_4_ = -(uint)(iVar172 < DAT_009d2b80._8_4_);
  auVar124._0_4_ = -(uint)(DAT_009d2b80._4_4_ == iVar85);
  auVar124._4_4_ = -(uint)(DAT_009d2b80._4_4_ == iVar85);
  auVar124._8_4_ = -(uint)(DAT_009d2b80._12_4_ == iVar176);
  auVar124._12_4_ = -(uint)(DAT_009d2b80._12_4_ == iVar176);
  auVar124 = auVar124 & auVar141;
  auVar114 = packssdw(_DAT_009d2b80,auVar124);
  auVar126._8_4_ = 0xffffffff;
  auVar126._0_8_ = 0xffffffffffffffff;
  auVar126._12_4_ = 0xffffffff;
  auVar114 = packssdw(auVar114 ^ auVar126,auVar114 ^ auVar126);
  if ((auVar114 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
    local_1d8[6] = 6;
  }
  auVar114 = pshufhw(auVar124,auVar124,0x84);
  auVar114 = packssdw(auVar114 ^ auVar126,auVar114 ^ auVar126);
  if ((auVar114 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
    local_1d8[7] = 7;
  }
  if (0 < iVar89) {
    uVar92 = 0;
    UVar96 = local_1d8[0];
    do {
      UVar4 = s->selector[uVar92];
      lVar87 = 0;
      UVar78 = UVar96;
      while (UVar4 != UVar78) {
        UVar5 = local_1d8[lVar87 + 1];
        local_1d8[lVar87 + 1] = UVar78;
        lVar87 = lVar87 + 1;
        UVar96 = UVar4;
        UVar78 = UVar5;
      }
      s->selectorMtf[uVar92] = (UChar)lVar87;
      uVar92 = uVar92 + 1;
    } while (uVar92 != (uVar80 & 0xffffffff));
  }
  uVar92 = 0;
  paUVar106 = paUVar1;
  do {
    uVar91 = 0x20;
    uVar83 = 0;
    if (-2 < iVar90) {
      sVar104 = 0;
      uVar83 = 0;
      do {
        uVar86 = (uint)(*paUVar106)[sVar104];
        if (uVar83 <= (*paUVar106)[sVar104]) {
          uVar83 = uVar86;
        }
        if (uVar91 < uVar86) {
          uVar86 = uVar91;
        }
        uVar91 = uVar86;
        sVar104 = sVar104 + 1;
      } while (local_190 != sVar104);
      if (0x11 < uVar83) {
        BZ2_bz__AssertH__fail(0xbbc);
      }
      if (uVar91 == 0) {
        BZ2_bz__AssertH__fail(0xbbd);
      }
    }
    BZ2_hbAssignCodes(s->code[uVar92],paUVar1[uVar92],uVar91,uVar83,local_1b8);
    sVar104 = local_190;
    auVar114 = local_1a8;
    uVar92 = uVar92 + 1;
    paUVar106 = paUVar106 + 1;
  } while (uVar92 != uVar110);
  lVar87 = 0;
  pBVar94 = local_158;
  do {
    local_1d8[lVar87] = '\0';
    auVar127[0] = -(*pBVar94 == '\0');
    auVar127[1] = -(pBVar94[1] == '\0');
    auVar127[2] = -(pBVar94[2] == '\0');
    auVar127[3] = -(pBVar94[3] == '\0');
    auVar127[4] = -(pBVar94[4] == '\0');
    auVar127[5] = -(pBVar94[5] == '\0');
    auVar127[6] = -(pBVar94[6] == '\0');
    auVar127[7] = -(pBVar94[7] == '\0');
    auVar127[8] = -(pBVar94[8] == '\0');
    auVar127[9] = -(pBVar94[9] == '\0');
    auVar127[10] = -(pBVar94[10] == '\0');
    auVar127[0xb] = -(pBVar94[0xb] == '\0');
    auVar127[0xc] = -(pBVar94[0xc] == '\0');
    auVar127[0xd] = -(pBVar94[0xd] == '\0');
    auVar127[0xe] = -(pBVar94[0xe] == '\0');
    auVar127[0xf] = -(pBVar94[0xf] == '\0');
    if ((ushort)((ushort)(SUB161(auVar127 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar127 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar127 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar127 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar127 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar127 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar127 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar127 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar127 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar127 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar127 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar127 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar127 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar127 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar127 >> 0x77,0) & 1) << 0xe |
                (ushort)(auVar127[0xf] >> 7) << 0xf) != 0xffff) {
      local_1d8[lVar87] = '\x01';
    }
    lVar87 = lVar87 + 1;
    pBVar94 = pBVar94 + 0x10;
  } while (lVar87 != 0x10);
  iVar84 = s->numZ;
  iVar89 = s->bsLive;
  uVar83 = s->bsBuff;
  lVar87 = 0;
  iVar85 = iVar84;
  do {
    if (local_1d8[lVar87] == '\0') {
      if (7 < iVar89) {
        do {
          s->zbits[iVar85] = (UChar)(uVar83 >> 0x18);
          iVar85 = s->numZ + 1;
          s->numZ = iVar85;
          uVar83 = s->bsBuff << 8;
          s->bsBuff = uVar83;
          iVar172 = s->bsLive;
          iVar89 = iVar172 + -8;
          s->bsLive = iVar89;
        } while (0xf < iVar172);
      }
    }
    else {
      if (7 < iVar89) {
        do {
          s->zbits[iVar85] = (UChar)(uVar83 >> 0x18);
          iVar85 = s->numZ + 1;
          s->numZ = iVar85;
          uVar83 = s->bsBuff << 8;
          s->bsBuff = uVar83;
          iVar172 = s->bsLive;
          iVar89 = iVar172 + -8;
          s->bsLive = iVar89;
        } while (0xf < iVar172);
      }
      uVar83 = uVar83 | 0x80000000U >> ((byte)iVar89 & 0x1f);
    }
    iVar89 = iVar89 + 1;
    s->bsBuff = uVar83;
    s->bsLive = iVar89;
    lVar87 = lVar87 + 1;
  } while (lVar87 != 0x10);
  lVar87 = 0;
  do {
    if (local_1d8[lVar87] != '\0') {
      lVar102 = 0;
      do {
        if (local_158[lVar102 + lVar87 * 0x10] == '\0') {
          if (7 < iVar89) {
            do {
              s->zbits[iVar85] = (UChar)(uVar83 >> 0x18);
              iVar85 = s->numZ + 1;
              s->numZ = iVar85;
              uVar83 = s->bsBuff << 8;
              s->bsBuff = uVar83;
              iVar172 = s->bsLive;
              iVar89 = iVar172 + -8;
              s->bsLive = iVar89;
            } while (0xf < iVar172);
          }
        }
        else {
          if (7 < iVar89) {
            do {
              s->zbits[iVar85] = (UChar)(uVar83 >> 0x18);
              iVar85 = s->numZ + 1;
              s->numZ = iVar85;
              uVar83 = s->bsBuff << 8;
              s->bsBuff = uVar83;
              iVar172 = s->bsLive;
              iVar89 = iVar172 + -8;
              s->bsLive = iVar89;
            } while (0xf < iVar172);
          }
          uVar83 = uVar83 | 0x80000000U >> ((byte)iVar89 & 0x1f);
        }
        iVar89 = iVar89 + 1;
        s->bsBuff = uVar83;
        s->bsLive = iVar89;
        lVar102 = lVar102 + 1;
      } while (lVar102 != 0x10);
    }
    lVar87 = lVar87 + 1;
  } while (lVar87 != 0x10);
  if (2 < s->verbosity) {
    fprintf(_stderr,"      bytes: mapping %d, ",(ulong)(uint)(iVar85 - iVar84));
    iVar85 = s->numZ;
    iVar89 = s->bsLive;
    uVar83 = s->bsBuff;
  }
  iVar84 = iVar85;
  if (7 < iVar89) {
    do {
      s->zbits[iVar84] = (UChar)(uVar83 >> 0x18);
      iVar84 = s->numZ + 1;
      s->numZ = iVar84;
      uVar83 = s->bsBuff << 8;
      s->bsBuff = uVar83;
      iVar172 = s->bsLive;
      iVar89 = iVar172 + -8;
      s->bsLive = iVar89;
    } while (0xf < iVar172);
  }
  iVar172 = iVar89 + 3;
  uVar83 = (uint)uVar110 << (0x1dU - (char)iVar89 & 0x1f) | uVar83;
  s->bsBuff = uVar83;
  s->bsLive = iVar172;
  if (4 < iVar89) {
    do {
      s->zbits[iVar84] = (UChar)(uVar83 >> 0x18);
      iVar84 = s->numZ + 1;
      s->numZ = iVar84;
      uVar83 = s->bsBuff << 8;
      s->bsBuff = uVar83;
      iVar89 = s->bsLive;
      iVar172 = iVar89 + -8;
      s->bsLive = iVar172;
    } while (0xf < iVar89);
  }
  iVar89 = iVar172 + 0xf;
  uVar83 = auVar114._0_4_ << (0x11U - (char)iVar172 & 0x1f) | uVar83;
  uVar92 = (ulong)uVar83;
  s->bsBuff = uVar83;
  s->bsLive = iVar89;
  if (0 < auVar114._0_4_) {
    uVar97 = 0;
    do {
      bVar81 = s->selectorMtf[uVar97];
      if (bVar81 != 0) {
        uVar83 = 0;
        do {
          uVar91 = (uint)uVar92;
          if (7 < iVar89) {
            do {
              s->zbits[iVar84] = (UChar)(uVar92 >> 0x18);
              iVar84 = s->numZ + 1;
              s->numZ = iVar84;
              uVar91 = s->bsBuff << 8;
              uVar92 = (ulong)uVar91;
              s->bsBuff = uVar91;
              iVar172 = s->bsLive;
              iVar89 = iVar172 + -8;
              s->bsLive = iVar89;
            } while (0xf < iVar172);
            bVar81 = s->selectorMtf[uVar97];
          }
          bVar82 = (byte)iVar89;
          iVar89 = iVar89 + 1;
          uVar91 = uVar91 | 0x80000000U >> (bVar82 & 0x1f);
          uVar92 = (ulong)uVar91;
          s->bsBuff = uVar91;
          s->bsLive = iVar89;
          uVar83 = uVar83 + 1;
        } while (uVar83 < bVar81);
      }
      if (7 < iVar89) {
        do {
          s->zbits[iVar84] = (UChar)(uVar92 >> 0x18);
          iVar84 = s->numZ + 1;
          s->numZ = iVar84;
          uVar83 = s->bsBuff << 8;
          uVar92 = (ulong)uVar83;
          s->bsBuff = uVar83;
          iVar172 = s->bsLive;
          iVar89 = iVar172 + -8;
          s->bsLive = iVar89;
        } while (0xf < iVar172);
      }
      iVar89 = iVar89 + 1;
      s->bsBuff = (UInt32)uVar92;
      s->bsLive = iVar89;
      uVar97 = uVar97 + 1;
    } while (uVar97 != (uVar80 & 0xffffffff));
  }
  if (2 < s->verbosity) {
    fprintf(_stderr,"selectors %d, ",(ulong)(uint)(iVar84 - iVar85));
    iVar84 = s->numZ;
    iVar89 = s->bsLive;
    uVar92 = (ulong)s->bsBuff;
  }
  uVar97 = 0;
  IVar111 = iVar84;
  do {
    uVar91 = (uint)uVar92;
    bVar81 = paUVar1[uVar97][0];
    uVar83 = (uint)bVar81;
    if (7 < iVar89) {
      do {
        s->zbits[IVar111] = (UChar)(uVar92 >> 0x18);
        IVar111 = s->numZ + 1;
        s->numZ = IVar111;
        uVar91 = s->bsBuff << 8;
        uVar92 = (ulong)uVar91;
        s->bsBuff = uVar91;
        iVar85 = s->bsLive;
        iVar89 = iVar85 + -8;
        s->bsLive = iVar89;
      } while (0xf < iVar85);
    }
    iVar85 = iVar89 + 5;
    uVar91 = (uint)bVar81 << (0x1bU - (char)iVar89 & 0x1f) | uVar91;
    s->bsBuff = uVar91;
    s->bsLive = iVar85;
    if (-2 < iVar90) {
      sVar93 = 0;
      do {
        bVar81 = paUVar1[uVar97][sVar93];
        for (; (int)uVar83 < (int)(uint)bVar81; uVar83 = uVar83 + 1) {
          if (7 < iVar85) {
            do {
              s->zbits[IVar111] = (UChar)(uVar91 >> 0x18);
              IVar111 = s->numZ + 1;
              s->numZ = IVar111;
              uVar91 = s->bsBuff << 8;
              s->bsBuff = uVar91;
              iVar89 = s->bsLive;
              iVar85 = iVar89 + -8;
              s->bsLive = iVar85;
            } while (0xf < iVar89);
          }
          cVar99 = (char)iVar85;
          iVar85 = iVar85 + 2;
          uVar91 = uVar91 | 2 << (0x1eU - cVar99 & 0x1f);
          s->bsBuff = uVar91;
          s->bsLive = iVar85;
          bVar81 = paUVar1[uVar97][sVar93];
        }
        if (bVar81 < uVar83) {
          do {
            if (7 < iVar85) {
              do {
                s->zbits[IVar111] = (UChar)(uVar91 >> 0x18);
                IVar111 = s->numZ + 1;
                s->numZ = IVar111;
                uVar91 = s->bsBuff << 8;
                s->bsBuff = uVar91;
                iVar89 = s->bsLive;
                iVar85 = iVar89 + -8;
                s->bsLive = iVar85;
              } while (0xf < iVar89);
            }
            cVar99 = (char)iVar85;
            iVar85 = iVar85 + 2;
            uVar91 = uVar91 | 3 << (0x1eU - cVar99 & 0x1f);
            s->bsBuff = uVar91;
            s->bsLive = iVar85;
            uVar83 = uVar83 - 1;
          } while ((int)(uint)paUVar1[uVar97][sVar93] < (int)uVar83);
        }
        if (7 < iVar85) {
          do {
            s->zbits[IVar111] = (UChar)(uVar91 >> 0x18);
            IVar111 = s->numZ + 1;
            s->numZ = IVar111;
            uVar91 = s->bsBuff << 8;
            s->bsBuff = uVar91;
            iVar89 = s->bsLive;
            iVar85 = iVar89 + -8;
            s->bsLive = iVar85;
          } while (0xf < iVar89);
        }
        iVar85 = iVar85 + 1;
        s->bsBuff = uVar91;
        s->bsLive = iVar85;
        sVar93 = sVar93 + 1;
      } while (sVar93 != sVar104);
    }
    uVar97 = uVar97 + 1;
    uVar92 = (ulong)uVar91;
    iVar89 = iVar85;
  } while (uVar97 != uVar110);
  if (2 < s->verbosity) {
    fprintf(_stderr,"code lengths %d, ",(ulong)(uint)(IVar111 - iVar84));
    IVar111 = s->numZ;
  }
  iVar90 = s->nMTF;
  lVar87 = 0;
  if (0 < iVar90) {
    iVar89 = 0;
    do {
      iVar84 = iVar90 + -1;
      if (iVar89 + 0x31 < iVar90) {
        iVar84 = iVar89 + 0x31;
      }
      if ((uint)uVar110 <= (uint)s->selector[lVar87]) {
        BZ2_bz__AssertH__fail(0xbbe);
      }
      if (((byte)local_1c8 & iVar84 - iVar89 == 0x31) == 0) {
        if (iVar89 <= iVar84) {
          lVar102 = (long)iVar89;
          uVar83 = s->bsBuff;
          iVar90 = s->bsLive;
          do {
            bVar81 = s->selector[lVar87];
            bVar82 = (*paUVar1)
                     [(ulong)local_1c0[lVar102] + (ulong)bVar81 * 0x100 + (ulong)bVar81 * 2];
            iVar89 = s->code[0]
                     [(ulong)bVar81 * 2 + (ulong)bVar81 * 0x100 + (ulong)local_1c0[lVar102]];
            if (7 < iVar90) {
              IVar100 = s->numZ;
              do {
                s->zbits[IVar100] = (UChar)(uVar83 >> 0x18);
                IVar100 = s->numZ + 1;
                s->numZ = IVar100;
                uVar83 = s->bsBuff << 8;
                s->bsBuff = uVar83;
                iVar85 = s->bsLive;
                iVar90 = iVar85 + -8;
                s->bsLive = iVar90;
              } while (0xf < iVar85);
            }
            iVar90 = iVar90 + (uint)bVar82;
            uVar83 = uVar83 | iVar89 << (-(char)iVar90 & 0x1fU);
            s->bsBuff = uVar83;
            s->bsLive = iVar90;
            lVar102 = lVar102 + 1;
          } while (iVar84 + 1 != (int)lVar102);
        }
      }
      else {
        bVar81 = s->selector[lVar87];
        uVar97 = (ulong)bVar81;
        lVar102 = (ulong)bVar81 * 0x100 + uVar97 * 2;
        uVar92 = (ulong)bVar81;
        bVar81 = (*paUVar1)[(ulong)local_1c0[iVar89] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[iVar89]];
        UVar98 = s->bsBuff;
        iVar90 = s->bsLive;
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 1] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 1]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 2] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 2]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 3] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 3]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 4] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 4]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 5] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 5]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 6] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 6]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 7] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 7]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 8] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 8]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 9] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 9]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 10] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 10]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0xb] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0xb]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0xc] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0xc]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0xd] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0xd]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0xe] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0xe]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0xf] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0xf]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x10] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x10]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x11] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x11]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x12] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x12]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x13] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x13]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x14] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x14]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x15] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x15]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x16] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x16]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x17] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x17]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x18] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x18]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x19] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x19]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x1a] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x1a]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x1b] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x1b]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x1c] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x1c]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x1d] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x1d]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x1e] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x1e]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x1f] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x1f]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x20] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x20]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x21] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x21]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x22] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x22]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x23] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x23]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x24] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x24]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x25] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x25]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x26] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x26]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x27] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x27]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x28] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x28]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x29] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x29]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x2a] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x2a]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x2b] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x2b]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x2c] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x2c]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x2d] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x2d]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x2e] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x2e]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x2f] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x2f]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x30] + lVar102];
        iVar85 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x30]];
        if (7 < iVar90) {
          IVar100 = s->numZ;
          do {
            s->zbits[IVar100] = (UChar)(UVar98 >> 0x18);
            IVar100 = s->numZ + 1;
            s->numZ = IVar100;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        UVar98 = iVar85 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsBuff = UVar98;
        s->bsLive = iVar90;
        bVar81 = (*paUVar1)[(ulong)local_1c0[(long)iVar89 + 0x31] + lVar102];
        iVar89 = s->code[0][uVar97 * 2 + uVar92 * 0x100 + (ulong)local_1c0[(long)iVar89 + 0x31]];
        if (7 < iVar90) {
          iVar85 = s->numZ;
          do {
            s->zbits[iVar85] = (UChar)(UVar98 >> 0x18);
            iVar85 = s->numZ + 1;
            s->numZ = iVar85;
            UVar98 = s->bsBuff << 8;
            s->bsBuff = UVar98;
            iVar172 = s->bsLive;
            iVar90 = iVar172 + -8;
            s->bsLive = iVar90;
          } while (0xf < iVar172);
        }
        iVar90 = iVar90 + (uint)bVar81;
        s->bsBuff = iVar89 << (-(char)iVar90 & 0x1fU) | UVar98;
        s->bsLive = iVar90;
      }
      iVar89 = iVar84 + 1;
      lVar87 = lVar87 + 1;
      iVar90 = s->nMTF;
    } while (iVar89 < iVar90);
  }
  is_last_block = (Bool)local_174;
  if ((int)lVar87 != local_1a8._0_4_) {
    BZ2_bz__AssertH__fail(0xbbf);
  }
  if (2 < s->verbosity) {
    fprintf(_stderr,"codes %d\n",(ulong)(uint)(s->numZ - IVar111));
  }
LAB_004a94eb:
  if (is_last_block != '\0') {
    bsPutUChar(s,'\x17');
    bsPutUChar(s,'r');
    bsPutUChar(s,'E');
    bsPutUChar(s,'8');
    bsPutUChar(s,'P');
    bsPutUChar(s,0x90);
    bsPutUInt32(s,s->combinedCRC);
    if (1 < s->verbosity) {
      BZ2_compressBlock_cold_2();
    }
    if (0 < s->bsLive) {
      UVar98 = s->bsBuff;
      iVar90 = s->numZ;
      do {
        s->zbits[iVar90] = (UChar)(UVar98 >> 0x18);
        iVar90 = s->numZ + 1;
        s->numZ = iVar90;
        UVar98 = s->bsBuff << 8;
        s->bsBuff = UVar98;
        iVar89 = s->bsLive;
        s->bsLive = iVar89 + -8;
      } while (8 < iVar89);
    }
  }
  return;
}

Assistant:

void BZ2_compressBlock ( EState* s, Bool is_last_block )
{
   if (s->nblock > 0) {

      BZ_FINALISE_CRC ( s->blockCRC );
      s->combinedCRC = (s->combinedCRC << 1) | (s->combinedCRC >> 31);
      s->combinedCRC ^= s->blockCRC;
      if (s->blockNo > 1) s->numZ = 0;

      if (s->verbosity >= 2)
         VPrintf4( "    block %d: crc = 0x%08x, "
                   "combined CRC = 0x%08x, size = %d\n",
                   s->blockNo, s->blockCRC, s->combinedCRC, s->nblock );

      BZ2_blockSort ( s );
   }

   s->zbits = (UChar*) (&((UChar*)s->arr2)[s->nblock]);

   /*-- If this is the first block, create the stream header. --*/
   if (s->blockNo == 1) {
      BZ2_bsInitWrite ( s );
      bsPutUChar ( s, BZ_HDR_B );
      bsPutUChar ( s, BZ_HDR_Z );
      bsPutUChar ( s, BZ_HDR_h );
      bsPutUChar ( s, (UChar)(BZ_HDR_0 + s->blockSize100k) );
   }

   if (s->nblock > 0) {

      bsPutUChar ( s, 0x31 ); bsPutUChar ( s, 0x41 );
      bsPutUChar ( s, 0x59 ); bsPutUChar ( s, 0x26 );
      bsPutUChar ( s, 0x53 ); bsPutUChar ( s, 0x59 );

      /*-- Now the block's CRC, so it is in a known place. --*/
      bsPutUInt32 ( s, s->blockCRC );

      /*-- 
         Now a single bit indicating (non-)randomisation. 
         As of version 0.9.5, we use a better sorting algorithm
         which makes randomisation unnecessary.  So always set
         the randomised bit to 'no'.  Of course, the decoder
         still needs to be able to handle randomised blocks
         so as to maintain backwards compatibility with
         older versions of bzip2.
      --*/
      bsW(s,1,0);

      bsW ( s, 24, s->origPtr );
      generateMTFValues ( s );
      sendMTFValues ( s );
   }


   /*-- If this is the last block, add the stream trailer. --*/
   if (is_last_block) {

      bsPutUChar ( s, 0x17 ); bsPutUChar ( s, 0x72 );
      bsPutUChar ( s, 0x45 ); bsPutUChar ( s, 0x38 );
      bsPutUChar ( s, 0x50 ); bsPutUChar ( s, 0x90 );
      bsPutUInt32 ( s, s->combinedCRC );
      if (s->verbosity >= 2)
         VPrintf1( "    final combined CRC = 0x%08x\n   ", s->combinedCRC );
      bsFinishWrite ( s );
   }
}